

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall higan::Thread::Start(Thread *this)

{
  int iVar1;
  ThreadInternalAttr *this_00;
  Logger local_330;
  Fmt local_118;
  
  if (this->started == true) {
    Logger::Logger(&local_330,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                   ,0x40,"Start");
    Fmt::Fmt(&local_118,"thread: %s had started",(this->name_)._M_dataplus._M_p);
    Logger::operator<<(&local_330,&local_118);
    Logger::~Logger(&local_330);
  }
  this->started = true;
  this_00 = (ThreadInternalAttr *)operator_new(0x40);
  ThreadInternalAttr::ThreadInternalAttr(this_00,&this->name_,&this->function_);
  iVar1 = pthread_create(&this->thread_,(pthread_attr_t *)0x0,ThreadInternalFunction,this_00);
  if (iVar1 != 0) {
    Logger::Logger(&local_330,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                   ,0x49,"Start");
    Fmt::Fmt(&local_118,"thread: %s pthread_create error",(this->name_)._M_dataplus._M_p);
    Logger::operator<<(&local_330,&local_118);
    Logger::~Logger(&local_330);
  }
  return;
}

Assistant:

void Thread::Start()
{
	if (started)
	{
		LOG_FATAL << higan::Fmt("thread: %s had started", name_.c_str());
	}

	started = true;

	ThreadInternalAttr *attr = new ThreadInternalAttr(name_, function_);

	if (pthread_create(&thread_, nullptr, ThreadInternalFunction, static_cast<void*>(attr)) != 0)
	{
		LOG_FATAL << higan::Fmt("thread: %s pthread_create error", name_.c_str());
	}

}